

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_pass(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  undefined8 uVar6;
  int cell;
  long lVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  REF_NODE pRVar11;
  int iVar12;
  REF_INT tet0;
  REF_INT found;
  REF_INT tet1;
  REF_INT face_nodes [4];
  REF_INT cell_nodes [4];
  REF_INT found_nodes [27];
  REF_INT tri_nodes [27];
  int local_164;
  int local_160;
  int local_15c;
  REF_INT local_158;
  int local_154;
  REF_NODE local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined4 local_13c;
  REF_GRID local_130;
  REF_INT local_128 [4];
  REF_INT local_118 [3];
  int local_10c;
  undefined8 local_a8;
  undefined4 local_a0;
  
  ref_cell = ref_grid->cell[3];
  if (0 < ref_cell->max) {
    pRVar11 = ref_grid->node;
    ref_cell_00 = ref_grid->cell[8];
    cell = 0;
    do {
      RVar4 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_a8);
      if (RVar4 == 0) {
        local_140 = local_a0;
        local_148 = local_a8;
        local_13c = (undefined4)local_a8;
        uVar5 = ref_cell_with_face(ref_cell_00,(REF_INT *)&local_148,&local_160,&local_154);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0xc6,"ref_swap_pass",(ulong)uVar5,"unable to find tets with face");
          return uVar5;
        }
        if ((long)local_160 == -1) {
          pcVar9 = "boundary tet missing";
          uVar6 = 199;
LAB_001cfbb2:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 uVar6,"ref_swap_pass",pcVar9);
          return 1;
        }
        if (local_154 != -1) {
          pcVar9 = "boundary tri has two tets, not manifold";
          uVar6 = 200;
          goto LAB_001cfbb2;
        }
        iVar12 = ref_grid->mpi->id;
        pRVar1 = pRVar11->part;
        pRVar2 = ref_cell_00->c2n;
        lVar8 = (long)ref_cell_00->size_per * (long)local_160;
        if ((((iVar12 == pRVar1[pRVar2[lVar8]]) && (iVar12 == pRVar1[pRVar2[lVar8 + 1]])) &&
            (iVar12 == pRVar1[pRVar2[lVar8 + 2]])) && (iVar12 == pRVar1[pRVar2[lVar8 + 3]])) {
          lVar10 = 0;
          iVar12 = -1;
          lVar8 = 0;
          bVar3 = false;
          local_164 = -1;
          local_150 = pRVar11;
          local_130 = ref_grid;
          do {
            pRVar1 = ref_cell_00->c2n;
            pRVar2 = ref_cell_00->f2n;
            lVar7 = 0;
            do {
              local_128[lVar7] =
                   pRVar1[(long)ref_cell_00->size_per * (long)local_160 +
                          (long)*(int *)((long)pRVar2 + lVar7 * 4 + lVar10)];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            RVar4 = ref_cell_with(ref_cell,local_128,&local_158);
            if (RVar4 == 0) {
              local_15c = iVar12;
              uVar5 = ref_cell_nodes(ref_cell,local_158,local_118);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0xd9,"ref_swap_pass",(ulong)uVar5,"tri");
                return uVar5;
              }
              iVar12 = local_10c;
              if (local_15c != -1) {
                if (local_164 != -1) {
                  bVar3 = true;
                }
                local_164 = local_10c;
                iVar12 = local_15c;
              }
            }
            ref_grid = local_130;
            pRVar11 = local_150;
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar8 != 4);
          if (((local_164 != -1 && iVar12 != -1) && (iVar12 == local_164)) &&
             ((!bVar3 && (uVar5 = ref_swap_remove_two_face_cell(local_130,local_160), uVar5 != 0))))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0xe7,"ref_swap_pass",(ulong)uVar5,"remove it");
            return uVar5;
          }
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_swap_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_INT tri_index, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, face_nodes[4];
  REF_INT tet0, tet1;
  REF_INT faceid0, faceid1;
  REF_BOOL more_than_two;
  REF_INT cell_face, node, cell_nodes[4];
  REF_INT found, found_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT rank;

  each_ref_cell_valid_cell_with_nodes(tri, tri_index, tri_nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = tri_nodes[i];
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(tet, face_nodes, &tet0, &tet1),
        "unable to find tets with face");
    if (REF_EMPTY == tet0) THROW("boundary tet missing");
    if (REF_EMPTY != tet1) THROW("boundary tri has two tets, not manifold");

    /* must be local to swap */
    rank = ref_mpi_rank(ref_grid_mpi(ref_grid));
    if (rank != ref_node_part(ref_node, ref_cell_c2n(tet, 0, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 1, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 2, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 3, tet0)))
      continue;

    faceid0 = REF_EMPTY;
    faceid1 = REF_EMPTY;
    more_than_two = REF_FALSE;
    for (cell_face = 0; cell_face < 4; cell_face++) {
      for (node = 0; node < 4; node++)
        cell_nodes[node] = ref_cell_f2n(tet, node, cell_face, tet0);
      if (REF_SUCCESS == ref_cell_with(tri, cell_nodes, &found)) {
        RSS(ref_cell_nodes(tri, found, found_nodes), "tri");
        if (REF_EMPTY == faceid0) {
          faceid0 = found_nodes[3];
        } else {
          if (REF_EMPTY != faceid1) {
            more_than_two = REF_TRUE;
          }
          faceid1 = found_nodes[3];
        }
      }
    }
    if (REF_EMPTY == faceid0 || REF_EMPTY == faceid1 || faceid0 != faceid1 ||
        more_than_two)
      continue;
    RSS(ref_swap_remove_two_face_cell(ref_grid, tet0), "remove it");
  }
  return REF_SUCCESS;
}